

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageOperations.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArrayImageOpCompute::runShaders
          (TextureCubeMapArrayImageOpCompute *this,GLuint width,GLuint height,GLuint depth)

{
  SHADER_TO_CHECK SVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *this_00;
  char *msg;
  long lVar4;
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  SVar1 = this->m_shader_to_check;
  if (STC_VERTEX_SHADER < SVar1) {
    return;
  }
  if ((0x26U >> (SVar1 & 0x1f) & 1) == 0) {
    if ((0x18U >> (SVar1 & 0x1f) & 1) == 0) {
      (**(code **)(lVar4 + 0x528))(width,height,depth);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"Error running compute shader!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0x2c2);
      (**(code **)(lVar4 + 0xdb8))(0x400);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      msg = "Error setting memory barrier!";
      iVar2 = 0x2c4;
    }
    else {
      iVar2 = (**(code **)(lVar4 + 0xb48))(this->m_po_id,"dimensions");
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"Error getting uniform location!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0x2e3);
      if (iVar2 == -1) {
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Invalid location returned for active uniform!",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                   ,0x2e7);
        goto LAB_00d75adf;
      }
      (**(code **)(lVar4 + 0x1570))(iVar2,width,height,depth);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"Error setting value for uniform variable!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0x2eb);
      (**(code **)(lVar4 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,1);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"Error setting patch parameter!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0x2ee);
      (**(code **)(lVar4 + 0x538))((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,1);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"Rendering failed!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0x2f1);
      (**(code **)(lVar4 + 0xdb8))(0x400);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"Error setting memory barrier!",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                      ,0x2f3);
      (**(code **)(lVar4 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,3);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      msg = "Error setting patch parameter!";
      iVar2 = 0x2f6;
    }
  }
  else {
    iVar2 = (**(code **)(lVar4 + 0xb48))(this->m_po_id,"dimensions");
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Error getting uniform location!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x2ce);
    if (iVar2 == -1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid location returned for active uniform!",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                 ,0x2d2);
LAB_00d75adf:
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar4 + 0x1570))(iVar2,width,height,depth);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Error setting value for uniform variable!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x2d6);
    (**(code **)(lVar4 + 0x538))(0,0,1);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Rendering failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                    ,0x2d9);
    (**(code **)(lVar4 + 0xdb8))(0x400);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    msg = "Error setting memory barrier!";
    iVar2 = 0x2db;
  }
  glu::checkError(dVar3,msg,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayImageOperations.cpp"
                  ,iVar2);
  return;
}

Assistant:

void TextureCubeMapArrayImageOpCompute::runShaders(glw::GLuint width, glw::GLuint height, glw::GLuint depth)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	switch (m_shader_to_check)
	{
	/* Call compute shader */
	case STC_COMPUTE_SHADER:
	{
		gl.dispatchCompute(width, height, depth);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error running compute shader!");
		gl.memoryBarrier(GL_FRAMEBUFFER_BARRIER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting memory barrier!");

		break;
	}
	/* Run programs for VERTEX/FRAGMENT/GEOMETRY shader */
	case STC_VERTEX_SHADER:
	case STC_FRAGMENT_SHADER:
	case STC_GEOMETRY_SHADER:
	{
		glw::GLint dimensions_location = gl.getUniformLocation(m_po_id, "dimensions");
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting uniform location!");

		if (dimensions_location == -1)
		{
			TCU_FAIL("Invalid location returned for active uniform!");
		}

		gl.uniform3i(dimensions_location, width, height, depth);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting value for uniform variable!");

		gl.drawArrays(GL_POINTS, 0, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed!");
		gl.memoryBarrier(GL_FRAMEBUFFER_BARRIER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting memory barrier!");

		break;
	}
	case STC_TESSELLATION_CONTROL_SHADER:
	case STC_TESSELLATION_EVALUATION_SHADER:
	{
		glw::GLint dimensions_location = gl.getUniformLocation(m_po_id, "dimensions");
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting uniform location!");

		if (dimensions_location == -1)
		{
			TCU_FAIL("Invalid location returned for active uniform!");
		}

		gl.uniform3i(dimensions_location, width, height, depth);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting value for uniform variable!");

		gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting patch parameter!");

		gl.drawArrays(m_glExtTokens.PATCHES, 0, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed!");
		gl.memoryBarrier(GL_FRAMEBUFFER_BARRIER_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting memory barrier!");

		gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 3);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Error setting patch parameter!");

		break;
	}
	}
}